

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geo_parquet.cpp
# Opt level: O0

void __thiscall
duckdb::GeoParquetFileMetadata::RegisterGeometryColumn
          (GeoParquetFileMetadata *this,string *column_name)

{
  ulong uVar1;
  mapped_type *pmVar2;
  string *in_RSI;
  GeoParquetColumnMetadata *in_RDI;
  lock_guard<std::mutex> glock;
  key_type *in_stack_ffffffffffffff48;
  
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)in_RDI,(mutex_type *)in_stack_ffffffffffffff48);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) != 0) {
    std::__cxx11::string::operator=((string *)&(in_RDI->bbox).min_y,in_RSI);
  }
  GeoParquetColumnMetadata::GeoParquetColumnMetadata((GeoParquetColumnMetadata *)0x0);
  pmVar2 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::GeoParquetColumnMetadata,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::GeoParquetColumnMetadata>_>_>
           ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::GeoParquetColumnMetadata,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::GeoParquetColumnMetadata>_>_>
                         *)in_RDI,in_stack_ffffffffffffff48);
  GeoParquetColumnMetadata::operator=(in_RDI,pmVar2);
  GeoParquetColumnMetadata::~GeoParquetColumnMetadata(in_RDI);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x6eb477);
  return;
}

Assistant:

void GeoParquetFileMetadata::RegisterGeometryColumn(const string &column_name) {
	lock_guard<mutex> glock(write_lock);
	if (primary_geometry_column.empty()) {
		primary_geometry_column = column_name;
	}
	geometry_columns[column_name] = GeoParquetColumnMetadata();
}